

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O3

void test_fuzz_mtree(void)

{
  test_fuzz(test_fuzz_mtree::filesets);
  return;
}

Assistant:

DEFINE_TEST(test_fuzz_mtree)
{
	static const char *fileset1[] = {
		"test_read_format_mtree.mtree",
		NULL
	};
	static const struct files filesets[] = {
		{0, fileset1},
		{1, NULL}
	};
	test_fuzz(filesets);
}